

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::sparse::anon_unknown_0::UBOTestInstance::iterate
          (TestStatus *__return_storage_ptr__,UBOTestInstance *this)

{
  uint uVar1;
  VkQueue pVVar2;
  VkBuffer buffer_00;
  VkCommandBuffer_s *pVVar3;
  VkDescriptorPool descriptorPool;
  bool bVar4;
  PtrData<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  data;
  PtrData<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  data_00;
  PtrData<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  data_01;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_02;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_03;
  RefData<vk::Handle<(vk::HandleType)8>_> data_04;
  RefData<vk::Handle<(vk::HandleType)8>_> data_05;
  RefData<vk::Handle<(vk::HandleType)8>_> data_06;
  RefData<vk::Handle<(vk::HandleType)24>_> data_07;
  RefData<vk::VkCommandBuffer_s_*> data_08;
  RefData<vk::Handle<(vk::HandleType)19>_> data_09;
  RefData<vk::Handle<(vk::HandleType)21>_> data_10;
  RefData<vk::Handle<(vk::HandleType)22>_> data_11;
  RefData<vk::Handle<(vk::HandleType)8>_> data_12;
  VkBufferCreateInfo referenceCreateInfo;
  VkBufferCreateInfo referenceCreateInfo_00;
  VkBufferCreateInfo referenceCreateInfo_01;
  undefined8 uVar5;
  uint uVar6;
  MovePtr *vk_00;
  SparseAllocationBuilder *pSVar7;
  VkDevice pVVar8;
  Allocator *pAVar9;
  VkPhysicalDeviceProperties *pVVar10;
  SparseAllocation *pSVar11;
  Handle<(vk::HandleType)8> *pHVar12;
  size_type sVar13;
  Allocation *pAVar14;
  int *piVar15;
  VkDeviceMemory memory;
  VkDeviceSize VVar16;
  Handle<(vk::HandleType)24> *pHVar17;
  VkCommandBuffer_s **ppVVar18;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  Handle<(vk::HandleType)21> *pHVar19;
  Handle<(vk::HandleType)19> *pHVar20;
  Handle<(vk::HandleType)22> *pHVar21;
  DescriptorSetUpdateBuilder *this_02;
  void *dst;
  mapped_type *ppVVar22;
  MovePtr *pMVar23;
  VkStructureType VVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  Handle<(vk::HandleType)8> *local_ab8;
  ulong local_9e0;
  map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  local_8e8;
  VkDescriptorSetLayout local_8b8;
  key_type local_8ac;
  undefined1 local_8a8 [8];
  SpecializationMap specMap;
  VkSpecializationInfo specInfo;
  VkSpecializationMapEntry specMapEntries [2];
  deUint32 numEntriesPerChunk;
  deUint32 numBufferEntries_1;
  vector<int,_std::allocator<int>_> specializationData;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_7f8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_7e8;
  VkBufferCreateInfo local_7d8;
  Move<vk::Handle<(vk::HandleType)8>_> local_7a0;
  RefData<vk::Handle<(vk::HandleType)8>_> local_780;
  undefined8 local_760;
  VkDeviceSize vertexBufferSize;
  Vec4 vertexData [4];
  Location local_710;
  VkDescriptorSet local_708;
  DescriptorSetUpdateBuilder local_700;
  deUint64 local_6b8;
  undefined1 local_6b0 [8];
  VkDescriptorBufferInfo sparseBufferInfo;
  VkBuffer buffer;
  Move<vk::Handle<(vk::HandleType)22>_> local_680;
  RefData<vk::Handle<(vk::HandleType)22>_> local_660;
  DescriptorPoolBuilder local_640;
  Move<vk::Handle<(vk::HandleType)21>_> local_628;
  RefData<vk::Handle<(vk::HandleType)21>_> local_608;
  DescriptorSetLayoutBuilder local_5e8;
  Move<vk::Handle<(vk::HandleType)19>_> local_5a0;
  RefData<vk::Handle<(vk::HandleType)19>_> local_580;
  deUint32 local_55c;
  deUint64 dStack_558;
  deUint32 maxBufferRange;
  deUint64 local_550;
  deUint64 local_548;
  Move<vk::VkCommandBuffer_s_*> local_540;
  RefData<vk::VkCommandBuffer_s_*> local_520;
  undefined1 local_500 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_4c0;
  undefined1 local_4a0 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkBufferCopy copyRegion;
  Vector<int,_4> local_45c;
  uint local_44c;
  void *pvStack_448;
  deUint32 i;
  IVec4 *pData;
  deUint64 local_438;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_430;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_420;
  undefined1 local_410 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> stagingBufferAlloc;
  Move<vk::Handle<(vk::HandleType)8>_> local_3c8;
  RefData<vk::Handle<(vk::HandleType)8>_> local_3a8;
  undefined1 local_388 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> stagingBuffer;
  deUint32 numBufferEntries;
  VkDeviceSize stagingBufferSize;
  VkDeviceSize chunkSize;
  bool hasAliasedChunk;
  Move<vk::Handle<(vk::HandleType)8>_> local_340;
  RefData<vk::Handle<(vk::HandleType)8>_> local_320;
  VkBuffer local_300;
  Move<vk::Handle<(vk::HandleType)8>_> local_2f8;
  RefData<vk::Handle<(vk::HandleType)8>_> local_2d8;
  VkDeviceSize local_2b8;
  VkBufferCreateInfo VStack_2b0;
  PtrData<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  local_278;
  PtrData<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  *local_268;
  undefined1 local_258 [8];
  SparseAllocationBuilder builder;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  VkBufferUsageFlags VStack_1f0;
  VkSharingMode VStack_1ec;
  SparseAllocationBuilder local_1d8;
  PtrData<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  local_198;
  PtrData<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  *local_188;
  VkDeviceSize local_178;
  VkBufferCreateInfo VStack_170;
  SparseAllocationBuilder local_138;
  PtrData<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  local_f8;
  PtrData<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  *local_e8;
  undefined1 local_d8 [8];
  UniquePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  minAllocation;
  deUint32 numMaxChunks;
  VkDeviceSize minChunkSize;
  VkBufferCreateInfo referenceBufferCreateInfo;
  Move<vk::Handle<(vk::HandleType)8>_> sparseBufferAliased;
  undefined1 local_50 [8];
  Move<vk::Handle<(vk::HandleType)8>_> sparseBuffer;
  MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  sparseAllocation;
  DeviceInterface *vk;
  UBOTestInstance *this_local;
  
  vk_00 = (MovePtr *)
          SparseResourcesBaseInstance::getDeviceInterface((SparseResourcesBaseInstance *)this);
  de::details::
  MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ::MovePtr((MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
             *)&sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                m_allocator);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)local_50);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)&referenceBufferCreateInfo.pQueueFamilyIndices)
  ;
  SparseBufferTestInstance::getSparseBufferCreateInfo
            ((VkBufferCreateInfo *)&minChunkSize,&this->super_SparseBufferTestInstance,0x10);
  minAllocation.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  .m_data._12_4_ = 0;
  SparseAllocationBuilder::SparseAllocationBuilder(&local_138);
  pSVar7 = SparseAllocationBuilder::addMemoryBind(&local_138,1);
  pVVar8 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  pAVar9 = SparseResourcesBaseInstance::getAllocator((SparseResourcesBaseInstance *)this);
  VStack_170.queueFamilyIndexCount = referenceBufferCreateInfo.queueFamilyIndexCount;
  VStack_170._44_4_ = referenceBufferCreateInfo._44_4_;
  VStack_170.size = referenceBufferCreateInfo.size;
  VStack_170.usage = referenceBufferCreateInfo.usage;
  VStack_170.sharingMode = referenceBufferCreateInfo.sharingMode;
  VStack_170.pNext = referenceBufferCreateInfo.pNext;
  VStack_170.flags = referenceBufferCreateInfo.flags;
  VStack_170._20_4_ = referenceBufferCreateInfo._20_4_;
  local_178 = minChunkSize;
  VStack_170.sType = referenceBufferCreateInfo.sType;
  VStack_170._4_4_ = referenceBufferCreateInfo._4_4_;
  VVar24 = referenceBufferCreateInfo.sType;
  uVar25 = referenceBufferCreateInfo._4_4_;
  referenceCreateInfo.pNext._0_4_ = VVar24;
  referenceCreateInfo._0_8_ = minChunkSize;
  referenceCreateInfo.pNext._4_4_ = uVar25;
  referenceCreateInfo._16_8_ = referenceBufferCreateInfo.pNext;
  referenceCreateInfo.size = referenceBufferCreateInfo._16_8_;
  referenceCreateInfo.usage = (int)referenceBufferCreateInfo.size;
  referenceCreateInfo.sharingMode = (int)(referenceBufferCreateInfo.size >> 0x20);
  referenceCreateInfo.queueFamilyIndexCount = referenceBufferCreateInfo.usage;
  referenceCreateInfo._44_4_ = referenceBufferCreateInfo.sharingMode;
  referenceCreateInfo.pQueueFamilyIndices = (deUint32 *)referenceBufferCreateInfo._40_8_;
  VVar16 = minChunkSize;
  SparseAllocationBuilder::build
            ((MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
              *)&local_f8,pSVar7,(DeviceInterface *)vk_00,pVVar8,pAVar9,referenceCreateInfo,0x200);
  local_e8 = de::details::MovePtr::operator_cast_to_PtrData(&local_f8,(MovePtr *)pSVar7);
  data._8_4_ = VVar24;
  data.ptr = (SparseAllocation *)VVar16;
  data._12_4_ = uVar25;
  de::details::
  UniquePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ::UniquePtr((UniquePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
               *)local_d8,data);
  de::details::
  MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ::~MovePtr((MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
              *)&local_f8);
  SparseAllocationBuilder::~SparseAllocationBuilder(&local_138);
  pVVar10 = Context::getDeviceProperties
                      ((this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
                       super_TestInstance.m_context);
  uVar1 = (pVVar10->limits).maxUniformBufferRange;
  pSVar11 = de::details::
            UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
            ::operator->((UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                          *)local_d8);
  minAllocation.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  .m_data._12_4_ = deMaxu32((deUint32)((ulong)uVar1 / pSVar11->resourceSize),1);
  de::details::
  UniquePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ::~UniquePtr((UniquePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                *)local_d8);
  if ((uint)minAllocation.
            super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
            .m_data._12_4_ < 4) {
    SparseAllocationBuilder::SparseAllocationBuilder(&local_1d8);
    pSVar7 = SparseAllocationBuilder::addMemoryBind(&local_1d8,1);
    pVVar8 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
    pAVar9 = SparseResourcesBaseInstance::getAllocator((SparseResourcesBaseInstance *)this);
    builder.m_chunksPerAllocation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)minChunkSize;
    local_1f8 = (undefined4)referenceBufferCreateInfo.size;
    uStack_1f4 = (undefined4)(referenceBufferCreateInfo.size >> 0x20);
    VStack_1f0 = referenceBufferCreateInfo.usage;
    VStack_1ec = referenceBufferCreateInfo.sharingMode;
    VVar24 = referenceBufferCreateInfo.sType;
    uVar25 = referenceBufferCreateInfo._4_4_;
    referenceCreateInfo_00.pNext._0_4_ = VVar24;
    referenceCreateInfo_00._0_8_ = minChunkSize;
    referenceCreateInfo_00.pNext._4_4_ = uVar25;
    referenceCreateInfo_00._16_8_ = referenceBufferCreateInfo.pNext;
    referenceCreateInfo_00.size = referenceBufferCreateInfo._16_8_;
    referenceCreateInfo_00.usage = local_1f8;
    referenceCreateInfo_00.sharingMode = uStack_1f4;
    referenceCreateInfo_00.queueFamilyIndexCount = VStack_1f0;
    referenceCreateInfo_00._44_4_ = VStack_1ec;
    referenceCreateInfo_00.pQueueFamilyIndices = (deUint32 *)referenceBufferCreateInfo._40_8_;
    SparseAllocationBuilder::build
              ((MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                *)&local_198,pSVar7,(DeviceInterface *)vk_00,pVVar8,pAVar9,referenceCreateInfo_00,
               0x200);
    local_188 = de::details::MovePtr::operator_cast_to_PtrData(&local_198,(MovePtr *)pSVar7);
    data_00._8_4_ = VVar24;
    data_00.ptr = (SparseAllocation *)minChunkSize;
    data_00._12_4_ = uVar25;
    de::details::
    MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
    ::operator=((MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                 *)&sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                    m_allocator,data_00);
    de::details::
    MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
    ::~MovePtr((MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                *)&local_198);
    SparseAllocationBuilder::~SparseAllocationBuilder(&local_1d8);
  }
  else {
    SparseAllocationBuilder::SparseAllocationBuilder((SparseAllocationBuilder *)local_258);
    SparseAllocationBuilder::addMemoryBind((SparseAllocationBuilder *)local_258,1);
    if (((this->super_SparseBufferTestInstance).m_residency & 1U) != 0) {
      SparseAllocationBuilder::addResourceHole((SparseAllocationBuilder *)local_258,1);
    }
    pSVar7 = SparseAllocationBuilder::addMemoryAllocation((SparseAllocationBuilder *)local_258);
    pSVar7 = SparseAllocationBuilder::addMemoryHole(pSVar7,1);
    SparseAllocationBuilder::addMemoryBind(pSVar7,1);
    if (((this->super_SparseBufferTestInstance).m_aliased & 1U) != 0) {
      SparseAllocationBuilder::addAliasedMemoryBind((SparseAllocationBuilder *)local_258,0,0,1);
    }
    pVVar8 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
    pAVar9 = SparseResourcesBaseInstance::getAllocator((SparseResourcesBaseInstance *)this);
    VStack_2b0.queueFamilyIndexCount = referenceBufferCreateInfo.queueFamilyIndexCount;
    VStack_2b0._44_4_ = referenceBufferCreateInfo._44_4_;
    VStack_2b0.size = referenceBufferCreateInfo.size;
    VVar16 = VStack_2b0.size;
    VStack_2b0.usage = referenceBufferCreateInfo.usage;
    VStack_2b0.sharingMode = referenceBufferCreateInfo.sharingMode;
    uVar5 = VStack_2b0._32_8_;
    VStack_2b0.pNext = referenceBufferCreateInfo.pNext;
    VStack_2b0.flags = referenceBufferCreateInfo.flags;
    VStack_2b0._20_4_ = referenceBufferCreateInfo._20_4_;
    local_2b8 = minChunkSize;
    VStack_2b0.sType = referenceBufferCreateInfo.sType;
    VStack_2b0._4_4_ = referenceBufferCreateInfo._4_4_;
    VStack_2b0.size._0_4_ = (undefined4)referenceBufferCreateInfo.size;
    VStack_2b0.size._4_4_ = (undefined4)(referenceBufferCreateInfo.size >> 0x20);
    VStack_2b0.usage = referenceBufferCreateInfo.usage;
    VStack_2b0.sharingMode = referenceBufferCreateInfo.sharingMode;
    VVar24 = referenceBufferCreateInfo.sType;
    uVar25 = referenceBufferCreateInfo._4_4_;
    pSVar7 = (SparseAllocationBuilder *)local_258;
    referenceCreateInfo_01.pNext._0_4_ = VVar24;
    referenceCreateInfo_01._0_8_ = minChunkSize;
    referenceCreateInfo_01.pNext._4_4_ = uVar25;
    referenceCreateInfo_01._16_8_ = referenceBufferCreateInfo.pNext;
    referenceCreateInfo_01.size = referenceBufferCreateInfo._16_8_;
    referenceCreateInfo_01.usage = (undefined4)VStack_2b0.size;
    referenceCreateInfo_01.sharingMode = VStack_2b0.size._4_4_;
    referenceCreateInfo_01.queueFamilyIndexCount = VStack_2b0.usage;
    referenceCreateInfo_01._44_4_ = VStack_2b0.sharingMode;
    referenceCreateInfo_01.pQueueFamilyIndices = (deUint32 *)referenceBufferCreateInfo._40_8_;
    VStack_2b0.size = VVar16;
    VStack_2b0._32_8_ = uVar5;
    SparseAllocationBuilder::build
              ((MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                *)&local_278,pSVar7,(DeviceInterface *)vk_00,pVVar8,pAVar9,referenceCreateInfo_01,
               0x200);
    local_268 = de::details::MovePtr::operator_cast_to_PtrData(&local_278,(MovePtr *)pSVar7);
    data_01._8_4_ = VVar24;
    data_01.ptr = (SparseAllocation *)minChunkSize;
    data_01._12_4_ = uVar25;
    de::details::
    MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
    ::operator=((MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                 *)&sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                    m_allocator,data_01);
    de::details::
    MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
    ::~MovePtr((MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                *)&local_278);
    SparseAllocationBuilder::~SparseAllocationBuilder((SparseAllocationBuilder *)local_258);
  }
  pSVar11 = de::details::
            UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
            ::operator->((UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                          *)&sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                             deleter.m_allocator);
  referenceBufferCreateInfo._16_8_ = pSVar11->resourceSize;
  pVVar8 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  makeBuffer(&local_2f8,(DeviceInterface *)vk_00,pVVar8,(VkBufferCreateInfo *)&minChunkSize);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2d8,(Move *)&local_2f8);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_2d8.deleter.m_deviceIface;
  data_04.object.m_internal = local_2d8.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2d8.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device = local_2d8.deleter.m_device;
  data_04.deleter.m_allocator = local_2d8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)8>_> *)local_50,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_2f8);
  pVVar8 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  pVVar2 = (this->super_SparseBufferTestInstance).m_sparseQueue.queueHandle;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_50);
  local_300.m_internal = pHVar12->m_internal;
  pSVar11 = de::details::
            UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
            ::operator*((UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                         *)&sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                            deleter.m_allocator);
  bindSparseBuffer((DeviceInterface *)vk_00,pVVar8,pVVar2,local_300,pSVar11);
  if (((this->super_SparseBufferTestInstance).m_aliased & 1U) != 0) {
    pVVar8 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
    makeBuffer(&local_340,(DeviceInterface *)vk_00,pVVar8,(VkBufferCreateInfo *)&minChunkSize);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_320,(Move *)&local_340);
    data_05.deleter.m_deviceIface._0_4_ = (int)local_320.deleter.m_deviceIface;
    data_05.object.m_internal = local_320.object.m_internal;
    data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_320.deleter.m_deviceIface >> 0x20);
    data_05.deleter.m_device = local_320.deleter.m_device;
    data_05.deleter.m_allocator = local_320.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=
              ((Move<vk::Handle<(vk::HandleType)8>_> *)
               &referenceBufferCreateInfo.pQueueFamilyIndices,data_05);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_340);
    pVVar8 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
    pVVar2 = (this->super_SparseBufferTestInstance).m_sparseQueue.queueHandle;
    pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                         &referenceBufferCreateInfo.pQueueFamilyIndices);
    buffer_00.m_internal = pHVar12->m_internal;
    pSVar11 = de::details::
              UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
              ::operator*((UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                           *)&sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                              deleter.m_allocator);
    bindSparseBuffer((DeviceInterface *)vk_00,pVVar8,pVVar2,buffer_00,pSVar11);
  }
  bVar4 = false;
  if (((this->super_SparseBufferTestInstance).m_aliased & 1U) != 0) {
    pSVar11 = de::details::
              UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
              ::operator->((UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                            *)&sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                               deleter.m_allocator);
    sVar13 = std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::size
                       (&pSVar11->memoryBinds);
    bVar4 = 1 < sVar13;
  }
  pSVar11 = de::details::
            UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
            ::operator->((UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                          *)&sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                             deleter.m_allocator);
  local_9e0 = pSVar11->resourceSize;
  pSVar11 = de::details::
            UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
            ::operator->((UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                          *)&sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                             deleter.m_allocator);
  local_9e0 = local_9e0 / pSVar11->numResourceChunks;
  pSVar11 = de::details::
            UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
            ::operator->((UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                          *)&sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                             deleter.m_allocator);
  if (!bVar4) {
    local_9e0 = 0;
  }
  local_9e0 = pSVar11->resourceSize - local_9e0;
  stagingBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator._4_4_ =
       (uint)(local_9e0 >> 4);
  pVVar8 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  makeBufferCreateInfo
            ((VkBufferCreateInfo *)
             &stagingBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
             ,local_9e0,1);
  makeBuffer(&local_3c8,(DeviceInterface *)vk_00,pVVar8,
             (VkBufferCreateInfo *)
             &stagingBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
            );
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_3a8,(Move *)&local_3c8);
  uVar25 = SUB84(local_3a8.deleter.m_deviceIface,0);
  uVar26 = (undefined4)((ulong)local_3a8.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_deviceIface._0_4_ = uVar25;
  data_06.object.m_internal = local_3a8.object.m_internal;
  data_06.deleter.m_deviceIface._4_4_ = uVar26;
  data_06.deleter.m_device = local_3a8.deleter.m_device;
  data_06.deleter.m_allocator = local_3a8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_388,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_3c8);
  pVVar8 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  pAVar9 = SparseResourcesBaseInstance::getAllocator((SparseResourcesBaseInstance *)this);
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_388);
  local_438 = pHVar12->m_internal;
  pData._4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  pMVar23 = vk_00;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_430,
             (DeviceInterface *)vk_00,pVVar8,pAVar9,(VkBuffer)local_438,
             ::vk::MemoryRequirement::HostVisible);
  local_420 = de::details::MovePtr::operator_cast_to_PtrData(&local_430,pMVar23);
  data_02._8_4_ = uVar25;
  data_02.ptr = (Allocation *)local_3a8.object.m_internal;
  data_02._12_4_ = uVar26;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_410,data_02);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_430);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_410)
  ;
  pvStack_448 = ::vk::Allocation::getHostPtr(pAVar14);
  for (local_44c = 0;
      local_44c <
      stagingBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator._4_4_;
      local_44c = local_44c + 1) {
    tcu::Vector<int,_4>::Vector(&local_45c,local_44c * 3 ^ 0x7f,0,0,0);
    piVar15 = (int *)((long)pvStack_448 + (ulong)local_44c * 0x10);
    *(undefined8 *)piVar15 = local_45c.m_data._0_8_;
    *(undefined8 *)(piVar15 + 2) = local_45c.m_data._8_8_;
  }
  pVVar8 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_410)
  ;
  memory = ::vk::Allocation::getMemory(pAVar14);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_410)
  ;
  VVar16 = ::vk::Allocation::getOffset(pAVar14);
  ::vk::flushMappedMemoryRange((DeviceInterface *)vk_00,pVVar8,memory,VVar16,local_9e0);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pVVar8 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                  &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
                  (DeviceInterface *)vk_00,pVVar8,
                  (this->super_SparseBufferTestInstance).m_universalQueue.queueFamilyIndex);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_4c0,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_07.deleter.m_deviceIface._0_4_ = (int)local_4c0.deleter.m_deviceIface;
  data_07.object.m_internal = local_4c0.object.m_internal;
  data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_4c0.deleter.m_deviceIface >> 0x20);
  data_07.deleter.m_device = local_4c0.deleter.m_device;
  data_07.deleter.m_allocator = local_4c0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_4a0,data_07);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pVVar8 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_4a0);
  local_548 = pHVar17->m_internal;
  ::vk::allocateCommandBuffer
            (&local_540,(DeviceInterface *)vk_00,pVVar8,(VkCommandPool)local_548,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_520,(Move *)&local_540);
  data_08.deleter.m_deviceIface._0_4_ = (int)local_520.deleter.m_deviceIface;
  data_08.object = local_520.object;
  data_08.deleter.m_deviceIface._4_4_ = (int)((ulong)local_520.deleter.m_deviceIface >> 0x20);
  data_08.deleter.m_device = local_520.deleter.m_device;
  data_08.deleter.m_pool.m_internal = local_520.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_500,data_08);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_540);
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_500);
  beginCommandBuffer((DeviceInterface *)vk_00,*ppVVar18);
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_500);
  pVVar3 = *ppVVar18;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_388);
  local_550 = pHVar12->m_internal;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_50);
  dStack_558 = pHVar12->m_internal;
  (*(*(_func_int ***)vk_00)[0x5f])
            (vk_00,pVVar3,local_550,dStack_558,1,
             &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator);
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_500);
  endCommandBuffer((DeviceInterface *)vk_00,*ppVVar18);
  pVVar8 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  pVVar2 = (this->super_SparseBufferTestInstance).m_universalQueue.queueHandle;
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_500);
  submitCommandsAndWait
            ((DeviceInterface *)vk_00,pVVar8,pVVar2,*ppVVar18,0,(VkSemaphore *)0x0,
             (VkPipelineStageFlags *)0x0,0,(VkSemaphore *)0x0);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_500);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_4a0);
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_410);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_388);
  pSVar11 = de::details::
            UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
            ::operator->((UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                          *)&sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                             deleter.m_allocator);
  VVar16 = pSVar11->resourceSize;
  pVVar10 = Context::getDeviceProperties
                      ((this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
                       super_TestInstance.m_context);
  local_55c = deMinu32((deUint32)VVar16,(pVVar10->limits).maxUniformBufferRange);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_5e8);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (&local_5e8,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,0x10);
  pVVar8 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  ::vk::DescriptorSetLayoutBuilder::build(&local_5a0,this_00,(DeviceInterface *)vk_00,pVVar8,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_580,(Move *)&local_5a0);
  data_09.deleter.m_deviceIface._0_4_ = (int)local_580.deleter.m_deviceIface;
  data_09.object.m_internal = local_580.object.m_internal;
  data_09.deleter.m_deviceIface._4_4_ = (int)((ulong)local_580.deleter.m_deviceIface >> 0x20);
  data_09.deleter.m_device = local_580.deleter.m_device;
  data_09.deleter.m_allocator = local_580.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::operator=
            (&this->m_descriptorSetLayout,data_09);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_5a0);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&local_5e8);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder(&local_640);
  this_01 = ::vk::DescriptorPoolBuilder::addType(&local_640,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1);
  pVVar8 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  ::vk::DescriptorPoolBuilder::build(&local_628,this_01,(DeviceInterface *)vk_00,pVVar8,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_608,(Move *)&local_628);
  data_10.deleter.m_deviceIface._0_4_ = (int)local_608.deleter.m_deviceIface;
  data_10.object.m_internal = local_608.object.m_internal;
  data_10.deleter.m_deviceIface._4_4_ = (int)((ulong)local_608.deleter.m_deviceIface >> 0x20);
  data_10.deleter.m_device = local_608.deleter.m_device;
  data_10.deleter.m_allocator = local_608.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::operator=
            (&this->m_descriptorPool,data_10);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_628);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder(&local_640);
  pVVar8 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                      (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  descriptorPool.m_internal = pHVar19->m_internal;
  pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>
                      );
  makeDescriptorSet(&local_680,(DeviceInterface *)vk_00,pVVar8,descriptorPool,
                    (VkDescriptorSetLayout)pHVar20->m_internal);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_660,(Move *)&local_680);
  data_11.deleter.m_deviceIface._0_4_ = (int)local_660.deleter.m_deviceIface;
  data_11.object.m_internal = local_660.object.m_internal;
  data_11.deleter.m_deviceIface._4_4_ = (int)((ulong)local_660.deleter.m_deviceIface >> 0x20);
  data_11.deleter.m_device = local_660.deleter.m_device;
  data_11.deleter.m_pool.m_internal = local_660.deleter.m_pool.m_internal;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::operator=(&this->m_descriptorSet,data_11)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_680);
  if (((this->super_SparseBufferTestInstance).m_aliased & 1U) == 0) {
    local_ab8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_50);
  }
  else {
    local_ab8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                           &referenceBufferCreateInfo.pQueueFamilyIndices);
  }
  local_6b8 = local_ab8->m_internal;
  sparseBufferInfo.range = local_6b8;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_6b0,(VkBuffer)local_6b8,0,(ulong)local_55c);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_700);
  pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  local_708.m_internal = pHVar21->m_internal;
  local_710 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  this_02 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_700,local_708,&local_710,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                       (VkDescriptorBufferInfo *)local_6b0);
  pVVar8 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,(DeviceInterface *)vk_00,pVVar8);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_700);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&vertexBufferSize,-1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(vertexData[0].m_data + 2),-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(vertexData[1].m_data + 2),1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(vertexData[2].m_data + 2),1.0,1.0,0.0,1.0);
  local_760 = 0x40;
  pVVar8 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  makeBufferCreateInfo(&local_7d8,0x40,0x80);
  makeBuffer(&local_7a0,(DeviceInterface *)vk_00,pVVar8,&local_7d8);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_780,(Move *)&local_7a0);
  uVar25 = SUB84(local_780.deleter.m_deviceIface,0);
  uVar26 = (undefined4)((ulong)local_780.deleter.m_deviceIface >> 0x20);
  data_12.deleter.m_deviceIface._0_4_ = uVar25;
  data_12.object.m_internal = local_780.object.m_internal;
  data_12.deleter.m_deviceIface._4_4_ = uVar26;
  data_12.deleter.m_device = local_780.deleter.m_device;
  data_12.deleter.m_allocator = local_780.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=(&this->m_vertexBuffer,data_12);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_7a0);
  pVVar8 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  pAVar9 = SparseResourcesBaseInstance::getAllocator((SparseResourcesBaseInstance *)this);
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      (&(this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  pMVar23 = vk_00;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_7f8,
             (DeviceInterface *)vk_00,pVVar8,pAVar9,(VkBuffer)pHVar12->m_internal,
             ::vk::MemoryRequirement::HostVisible);
  local_7e8 = de::details::MovePtr::operator_cast_to_PtrData(&local_7f8,pMVar23);
  data_03._8_4_ = uVar25;
  data_03.ptr = (Allocation *)local_780.object.m_internal;
  data_03._12_4_ = uVar26;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            (&this->m_vertexBufferAlloc,data_03);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_7f8);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_vertexBufferAlloc).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  dst = ::vk::Allocation::getHostPtr(pAVar14);
  ::deMemcpy(dst,&vertexBufferSize,0x40);
  pVVar8 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_vertexBufferAlloc).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  specializationData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)::vk::Allocation::getMemory(pAVar14);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_vertexBufferAlloc).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar16 = ::vk::Allocation::getOffset(pAVar14);
  ::vk::flushMappedMemoryRange
            ((DeviceInterface *)vk_00,pVVar8,
             (VkDeviceMemory)
             specializationData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,VVar16,0x40);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&numEntriesPerChunk);
  uVar6 = local_55c >> 4;
  pSVar11 = de::details::
            UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
            ::operator->((UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                          *)&sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                             deleter.m_allocator);
  uVar1 = pSVar11->numResourceChunks;
  specMapEntries[1].size._4_4_ = uVar6;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)&numEntriesPerChunk,
             (value_type_conflict5 *)((long)&specMapEntries[1].size + 4));
  specMapEntries[1].size._0_4_ = uVar6 / uVar1;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)&numEntriesPerChunk,
             (value_type_conflict5 *)&specMapEntries[1].size);
  specMapEntries[0].size = 0x400000002;
  specMapEntries[1].constantID = 4;
  specMapEntries[1].offset = 0;
  specInfo.pData = (void *)0x1;
  specMapEntries[0].constantID = 4;
  specMapEntries[0].offset = 0;
  specMap._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 2;
  specInfo._0_8_ = &specInfo.pData;
  specInfo.pMapEntries =
       (VkSpecializationMapEntry *)
       sizeInBytes<int>((vector<int,_std::allocator<int>_> *)&numEntriesPerChunk);
  specInfo.dataSize =
       (deUintptr)getDataOrNullptr<int>((vector<int,_std::allocator<int>_> *)&numEntriesPerChunk,0);
  std::
  map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  ::map((map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
         *)local_8a8);
  local_8ac = VK_SHADER_STAGE_FRAGMENT_BIT;
  ppVVar22 = std::
             map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
             ::operator[]((map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
                           *)local_8a8,&local_8ac);
  *ppVVar22 = (mapped_type)&specMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>
                      );
  local_8b8.m_internal = pHVar20->m_internal;
  std::
  map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  ::map(&local_8e8,
        (map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
         *)local_8a8);
  SparseBufferTestInstance::draw
            (&this->super_SparseBufferTestInstance,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,local_8b8,
             &local_8e8);
  std::
  map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  ::~map(&local_8e8);
  std::
  map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  ::~map((map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
          *)local_8a8);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&numEntriesPerChunk);
  SparseBufferTestInstance::verifyDrawResult
            (__return_storage_ptr__,&this->super_SparseBufferTestInstance);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)&referenceBufferCreateInfo.pQueueFamilyIndices)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)local_50);
  de::details::
  MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ::~MovePtr((MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
              *)&sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                 m_allocator);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const DeviceInterface&		vk					= getDeviceInterface();
		MovePtr<SparseAllocation>	sparseAllocation;
		Move<VkBuffer>				sparseBuffer;
		Move<VkBuffer>				sparseBufferAliased;

		// Set up the sparse buffer
		{
			VkBufferCreateInfo	referenceBufferCreateInfo	= getSparseBufferCreateInfo(VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT);
			const VkDeviceSize	minChunkSize				= 512u;	// make sure the smallest allocation is at least this big
			deUint32			numMaxChunks				= 0u;

			// Check how many chunks we can allocate given the alignment and size requirements of UBOs
			{
				const UniquePtr<SparseAllocation> minAllocation(SparseAllocationBuilder()
					.addMemoryBind()
					.build(vk, getDevice(), getAllocator(), referenceBufferCreateInfo, minChunkSize));

				numMaxChunks = deMaxu32(static_cast<deUint32>(m_context.getDeviceProperties().limits.maxUniformBufferRange / minAllocation->resourceSize), 1u);
			}

			if (numMaxChunks < 4)
			{
				sparseAllocation = SparseAllocationBuilder()
					.addMemoryBind()
					.build(vk, getDevice(), getAllocator(), referenceBufferCreateInfo, minChunkSize);
			}
			else
			{
				// Try to use a non-trivial memory allocation scheme to make it different from a non-sparse binding
				SparseAllocationBuilder builder;
				builder.addMemoryBind();

				if (m_residency)
					builder.addResourceHole();

				builder
					.addMemoryAllocation()
					.addMemoryHole()
					.addMemoryBind();

				if (m_aliased)
					builder.addAliasedMemoryBind(0u, 0u);

				sparseAllocation = builder.build(vk, getDevice(), getAllocator(), referenceBufferCreateInfo, minChunkSize);
				DE_ASSERT(sparseAllocation->resourceSize <= m_context.getDeviceProperties().limits.maxUniformBufferRange);
			}

			// Create the buffer
			referenceBufferCreateInfo.size	= sparseAllocation->resourceSize;
			sparseBuffer					= makeBuffer(vk, getDevice(), referenceBufferCreateInfo);
			bindSparseBuffer(vk, getDevice(), m_sparseQueue.queueHandle, *sparseBuffer, *sparseAllocation);

			if (m_aliased)
			{
				sparseBufferAliased = makeBuffer(vk, getDevice(), referenceBufferCreateInfo);
				bindSparseBuffer(vk, getDevice(), m_sparseQueue.queueHandle, *sparseBufferAliased, *sparseAllocation);
			}
		}

		// Set uniform data
		{
			const bool					hasAliasedChunk		= (m_aliased && sparseAllocation->memoryBinds.size() > 1u);
			const VkDeviceSize			chunkSize			= sparseAllocation->resourceSize / sparseAllocation->numResourceChunks;
			const VkDeviceSize			stagingBufferSize	= sparseAllocation->resourceSize - (hasAliasedChunk ? chunkSize : 0);
			const deUint32				numBufferEntries	= static_cast<deUint32>(stagingBufferSize / sizeof(IVec4));

			const Unique<VkBuffer>		stagingBuffer		(makeBuffer(vk, getDevice(), makeBufferCreateInfo(stagingBufferSize, VK_BUFFER_USAGE_TRANSFER_SRC_BIT)));
			const UniquePtr<Allocation>	stagingBufferAlloc	(bindBuffer(vk, getDevice(), getAllocator(), *stagingBuffer, MemoryRequirement::HostVisible));

			{
				// If aliased chunk is used, the staging buffer is smaller than the sparse buffer and we don't overwrite the last chunk
				IVec4* const pData = static_cast<IVec4*>(stagingBufferAlloc->getHostPtr());
				for (deUint32 i = 0; i < numBufferEntries; ++i)
					pData[i] = IVec4(3*i ^ 127, 0, 0, 0);

				flushMappedMemoryRange(vk, getDevice(), stagingBufferAlloc->getMemory(), stagingBufferAlloc->getOffset(), stagingBufferSize);

				const VkBufferCopy copyRegion =
				{
					0ull,						// VkDeviceSize    srcOffset;
					0ull,						// VkDeviceSize    dstOffset;
					stagingBufferSize,			// VkDeviceSize    size;
				};

				const Unique<VkCommandPool>		cmdPool		(makeCommandPool(vk, getDevice(), m_universalQueue.queueFamilyIndex));
				const Unique<VkCommandBuffer>	cmdBuffer	(allocateCommandBuffer(vk, getDevice(), *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

				beginCommandBuffer	(vk, *cmdBuffer);
				vk.cmdCopyBuffer	(*cmdBuffer, *stagingBuffer, *sparseBuffer, 1u, &copyRegion);
				endCommandBuffer	(vk, *cmdBuffer);

				submitCommandsAndWait(vk, getDevice(), m_universalQueue.queueHandle, *cmdBuffer);
				// Once the fence is signaled, the write is also available to the aliasing buffer.
			}
		}

		// Make sure that we don't try to access a larger range than is allowed. This only applies to a single chunk case.
		const deUint32 maxBufferRange = deMinu32(static_cast<deUint32>(sparseAllocation->resourceSize), m_context.getDeviceProperties().limits.maxUniformBufferRange);

		// Descriptor sets
		{
			m_descriptorSetLayout = DescriptorSetLayoutBuilder()
				.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_FRAGMENT_BIT)
				.build(vk, getDevice());

			m_descriptorPool = DescriptorPoolBuilder()
				.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER)
				.build(vk, getDevice(), VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

			m_descriptorSet = makeDescriptorSet(vk, getDevice(), *m_descriptorPool, *m_descriptorSetLayout);

			const VkBuffer					buffer				= (m_aliased ? *sparseBufferAliased : *sparseBuffer);
			const VkDescriptorBufferInfo	sparseBufferInfo	= makeDescriptorBufferInfo(buffer, 0ull, maxBufferRange);

			DescriptorSetUpdateBuilder()
				.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &sparseBufferInfo)
				.update(vk, getDevice());
		}

		// Vertex data
		{
			const Vec4 vertexData[] =
			{
				Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
				Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
				Vec4( 1.0f, -1.0f, 0.0f, 1.0f),
				Vec4( 1.0f,  1.0f, 0.0f, 1.0f),
			};

			const VkDeviceSize	vertexBufferSize	= sizeof(vertexData);

			m_vertexBuffer		= makeBuffer(vk, getDevice(), makeBufferCreateInfo(vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT));
			m_vertexBufferAlloc	= bindBuffer(vk, getDevice(), getAllocator(), *m_vertexBuffer, MemoryRequirement::HostVisible);

			deMemcpy(m_vertexBufferAlloc->getHostPtr(), &vertexData[0], vertexBufferSize);
			flushMappedMemoryRange(vk, getDevice(), m_vertexBufferAlloc->getMemory(), m_vertexBufferAlloc->getOffset(), vertexBufferSize);
		}

		// Draw
		{
			std::vector<deInt32> specializationData;
			{
				const deUint32	numBufferEntries	= maxBufferRange / static_cast<deUint32>(sizeof(IVec4));
				const deUint32	numEntriesPerChunk	= numBufferEntries / sparseAllocation->numResourceChunks;

				specializationData.push_back(numBufferEntries);
				specializationData.push_back(numEntriesPerChunk);
			}

			const VkSpecializationMapEntry	specMapEntries[] =
			{
				{
					1u,					// uint32_t    constantID;
					0u,					// uint32_t    offset;
					sizeof(deInt32),	// size_t      size;
				},
				{
					2u,					// uint32_t    constantID;
					sizeof(deInt32),	// uint32_t    offset;
					sizeof(deInt32),	// size_t      size;
				},
			};

			const VkSpecializationInfo specInfo =
			{
				DE_LENGTH_OF_ARRAY(specMapEntries),		// uint32_t                           mapEntryCount;
				specMapEntries,							// const VkSpecializationMapEntry*    pMapEntries;
				sizeInBytes(specializationData),		// size_t                             dataSize;
				getDataOrNullptr(specializationData),	// const void*                        pData;
			};

			Renderer::SpecializationMap	specMap;
			specMap[VK_SHADER_STAGE_FRAGMENT_BIT] = &specInfo;

			draw(VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP, *m_descriptorSetLayout, specMap);
		}

		return verifyDrawResult();
	}